

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

BranchInstr * __thiscall
Lowerer::InsertCompareBranch
          (Lowerer *this,Opnd *compareSrc1,Opnd *compareSrc2,OpCode branchOpCode,bool isUnsigned,
          LabelInstr *target,Instr *insertBeforeInstr,bool ignoreNaN)

{
  Func *func_00;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  IntConstOpnd *pIVar4;
  long lVar5;
  AddrOpnd *pAVar6;
  BranchInstr *pBVar7;
  Opnd *tempSrc;
  OpCode swapSrcsBranchOpCode;
  BranchInstr *instr;
  Func *func;
  bool ignoreNaN_local;
  LabelInstr *target_local;
  bool isUnsigned_local;
  Opnd *pOStack_28;
  OpCode branchOpCode_local;
  Opnd *compareSrc2_local;
  Opnd *compareSrc1_local;
  Lowerer *this_local;
  
  if (compareSrc1 == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3da0,"(compareSrc1)","compareSrc1");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (compareSrc2 == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3da1,"(compareSrc2)","compareSrc2");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  func_00 = insertBeforeInstr->m_func;
  bVar2 = IR::Opnd::IsFloat(compareSrc1);
  if (bVar2) {
    bVar2 = IR::Opnd::IsFloat(compareSrc2);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x3da7,"(compareSrc2->IsFloat())","compareSrc2->IsFloat()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    if (isUnsigned) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x3da8,"(!isUnsigned)","!isUnsigned");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    pBVar7 = IR::BranchInstr::New(branchOpCode,target,compareSrc1,compareSrc2,func_00);
    IR::Instr::InsertBefore(insertBeforeInstr,&pBVar7->super_Instr);
    pBVar7 = LowererMD::LowerFloatCondBranch(pBVar7,ignoreNaN);
    return pBVar7;
  }
  target_local._6_2_ = branchOpCode;
  pOStack_28 = compareSrc2;
  compareSrc2_local = compareSrc1;
  switch(branchOpCode) {
  case BrEq_A:
  case BrNeq_A:
    tempSrc._6_2_ = branchOpCode;
    break;
  default:
    goto LAB_007ac03f;
  case BrGe_A:
    tempSrc._6_2_ = BrLe_A;
    break;
  case BrGt_A:
    tempSrc._6_2_ = BrLt_A;
    break;
  case BrLt_A:
    tempSrc._6_2_ = BrGt_A;
    break;
  case BrLe_A:
    tempSrc._6_2_ = BrGe_A;
  }
  bVar2 = IR::Opnd::IsIntConstOpnd(compareSrc1);
  if (bVar2) {
LAB_007abf4b:
    bVar2 = IR::Opnd::IsIntConstOpnd(compareSrc2);
    if ((!bVar2) && (bVar2 = IR::Opnd::IsAddrOpnd(compareSrc2), !bVar2)) {
      target_local._6_2_ = tempSrc._6_2_;
      pOStack_28 = compareSrc1;
      compareSrc2_local = compareSrc2;
    }
  }
  else {
    bVar2 = IR::Opnd::IsAddrOpnd(compareSrc1);
    if (bVar2) {
      pAVar6 = IR::Opnd::AsAddrOpnd(compareSrc1);
      bVar2 = Math::FitsInDWord((size_t)pAVar6->m_address);
      if (bVar2) goto LAB_007abf4b;
    }
  }
  bVar2 = IR::Opnd::IsRegOpnd(compareSrc2_local);
  if (bVar2) {
    bVar2 = IR::Opnd::IsIntConstOpnd(pOStack_28);
    if (bVar2) {
      pIVar4 = IR::Opnd::AsIntConstOpnd(pOStack_28);
      lVar5 = IR::EncodableOpnd<long>::GetValue(&pIVar4->super_EncodableOpnd<long>);
      if (lVar5 != 0) goto LAB_007abfbe;
    }
    else {
LAB_007abfbe:
      bVar2 = IR::Opnd::IsAddrOpnd(pOStack_28);
      if ((!bVar2) || (pAVar6 = IR::Opnd::AsAddrOpnd(pOStack_28), pAVar6->m_address != (Var)0x0))
      goto LAB_007ac03f;
    }
    if ((target_local._6_2_ != BrGt_A) && (target_local._6_2_ != BrLe_A)) {
      if ((target_local._6_2_ == BrGe_A) || (target_local._6_2_ == BrLt_A)) {
        if (isUnsigned) goto LAB_007ac03f;
        target_local._6_2_ = LowererMD::MDCompareWithZeroBranchOpcode(target_local._6_2_);
      }
      bVar2 = IR::Opnd::IsInUse(pOStack_28);
      if (!bVar2) {
        IR::Opnd::Free(pOStack_28,func_00);
      }
      InsertTest(compareSrc2_local,compareSrc2_local,insertBeforeInstr);
      goto LAB_007ac050;
    }
  }
LAB_007ac03f:
  InsertCompare(compareSrc2_local,pOStack_28,insertBeforeInstr);
LAB_007ac050:
  pBVar7 = InsertBranch(target_local._6_2_,isUnsigned,target,insertBeforeInstr);
  return pBVar7;
}

Assistant:

IR::BranchInstr *Lowerer::InsertCompareBranch(
    IR::Opnd *compareSrc1,
    IR::Opnd *compareSrc2,
    Js::OpCode branchOpCode,
    const bool isUnsigned,
    IR::LabelInstr *const target,
    IR::Instr *const insertBeforeInstr,
    const bool ignoreNaN)
{
    Assert(compareSrc1);
    Assert(compareSrc2);

    Func *const func = insertBeforeInstr->m_func;

    if(compareSrc1->IsFloat())
    {
        Assert(compareSrc2->IsFloat());
        Assert(!isUnsigned);
        IR::BranchInstr *const instr = IR::BranchInstr::New(branchOpCode, target, compareSrc1, compareSrc2, func);
        insertBeforeInstr->InsertBefore(instr);
        return LowererMD::LowerFloatCondBranch(instr, ignoreNaN);
    }
#ifdef _M_IX86
    else if (compareSrc1->IsInt64())
    {
        Assert(compareSrc2->IsInt64());
        IR::BranchInstr *const instr = IR::BranchInstr::New(branchOpCode, target, compareSrc1, compareSrc2, func);
        insertBeforeInstr->InsertBefore(instr);
        m_lowererMD.EmitInt64Instr(instr);
        return instr;
    }
#endif

    Js::OpCode swapSrcsBranchOpCode;
    switch(branchOpCode)
    {
        case Js::OpCode::BrEq_A:
        case Js::OpCode::BrNeq_A:
            swapSrcsBranchOpCode = branchOpCode;
            goto Common_BrEqNeqGeGtLeLt;

        case Js::OpCode::BrGe_A:
            swapSrcsBranchOpCode = Js::OpCode::BrLe_A;
            goto Common_BrEqNeqGeGtLeLt;

        case Js::OpCode::BrGt_A:
            swapSrcsBranchOpCode = Js::OpCode::BrLt_A;
            goto Common_BrEqNeqGeGtLeLt;

        case Js::OpCode::BrLe_A:
            swapSrcsBranchOpCode = Js::OpCode::BrGe_A;
            goto Common_BrEqNeqGeGtLeLt;

        case Js::OpCode::BrLt_A:
            swapSrcsBranchOpCode = Js::OpCode::BrGt_A;
            // fall through

        Common_BrEqNeqGeGtLeLt:
            // Check if src1 is a constant and src2 is not, and facilitate folding the constant into the Cmp instruction
            if( (
                    compareSrc1->IsIntConstOpnd() ||
                    (
                        compareSrc1->IsAddrOpnd() &&
                        Math::FitsInDWord(reinterpret_cast<size_t>(compareSrc1->AsAddrOpnd()->m_address))
                    )
                ) &&
                !compareSrc2->IsIntConstOpnd() &&
                !compareSrc2->IsAddrOpnd())
            {
                // Swap the sources and branch
                IR::Opnd *const tempSrc = compareSrc1;
                compareSrc1 = compareSrc2;
                compareSrc2 = tempSrc;
                branchOpCode = swapSrcsBranchOpCode;
            }

            // Check for compare with zero, to prefer using Test instead of Cmp
            if( !compareSrc1->IsRegOpnd() ||
                !(
                    (compareSrc2->IsIntConstOpnd() && compareSrc2->AsIntConstOpnd()->GetValue() == 0) ||
                    (compareSrc2->IsAddrOpnd() && !compareSrc2->AsAddrOpnd()->m_address)
                ) ||
                branchOpCode == Js::OpCode::BrGt_A || branchOpCode == Js::OpCode::BrLe_A)
            {
                goto Default;
            }
            if(branchOpCode == Js::OpCode::BrGe_A || branchOpCode == Js::OpCode::BrLt_A)
            {
                if(isUnsigned)
                {
                    goto Default;
                }
                branchOpCode = LowererMD::MDCompareWithZeroBranchOpcode(branchOpCode);
            }
            if(!compareSrc2->IsInUse())
            {
                compareSrc2->Free(func);
            }
            InsertTest(compareSrc1, compareSrc1, insertBeforeInstr);
            break;

        default:
        Default:
            InsertCompare(compareSrc1, compareSrc2, insertBeforeInstr);
            break;
    }

    return InsertBranch(branchOpCode, isUnsigned, target, insertBeforeInstr);
}